

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O0

int cuddZddLinearInPlace(DdManager *table,int x,int y)

{
  DdHalfWord DVar1;
  uint uVar2;
  int iVar3;
  DdHalfWord DVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  DdNode **ppDVar8;
  DdNode **ppDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  ulong uVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  DdNode *local_c8;
  DdNode *special;
  DdNode *previous;
  DdNode *next;
  DdNode *g;
  DdNode *newf0;
  DdNode *newf1;
  DdNode *f00;
  DdNode *f01;
  DdNode *f10;
  DdNode *f11;
  DdNode *f0;
  DdNode *f1;
  DdNode *f;
  int posn;
  int i;
  int newykeys;
  int newxkeys;
  int oldykeys;
  int oldxkeys;
  int yshift;
  int xshift;
  int yslots;
  int xslots;
  int yindex;
  int xindex;
  DdNodePtr *ylist;
  DdNodePtr *xlist;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  zddTotalNumberLinearTr = zddTotalNumberLinearTr + 1;
  DVar1 = table->invpermZ[x];
  ppDVar8 = table->subtableZ[x].nodelist;
  uVar2 = table->subtableZ[x].keys;
  uVar14 = table->subtableZ[x].slots;
  iVar3 = table->subtableZ[x].shift;
  i = 0;
  DVar4 = table->invpermZ[y];
  ppDVar9 = table->subtableZ[y].nodelist;
  uVar5 = table->subtableZ[y].keys;
  uVar6 = table->subtableZ[y].slots;
  iVar7 = table->subtableZ[y].shift;
  local_c8 = (DdNode *)0x0;
  next = (DdNode *)0x0;
  for (f._4_4_ = 0; (int)f._4_4_ < (int)uVar14; f._4_4_ = f._4_4_ + 1) {
    f1 = ppDVar8[(int)f._4_4_];
    if (f1 != (DdNode *)0x0) {
      ppDVar8[(int)f._4_4_] = (DdNode *)0x0;
      while (f1 != (DdNode *)0x0) {
        pDVar10 = f1->next;
        pDVar11 = (f1->type).kids.T;
        pDVar11->ref = pDVar11->ref - 1;
        pDVar12 = (f1->type).kids.E;
        pDVar12->ref = pDVar12->ref - 1;
        if (((pDVar11->index == DVar4) && ((pDVar11->type).kids.E == empty)) &&
           (pDVar12->index != DVar4)) {
          f1->next = local_c8;
          local_c8 = f1;
          f1 = pDVar10;
        }
        else {
          f1->next = next;
          next = f1;
          f1 = pDVar10;
        }
      }
    }
  }
  for (f._4_4_ = 0; (int)f._4_4_ < (int)uVar6; f._4_4_ = f._4_4_ + 1) {
    for (f1 = ppDVar9[(int)f._4_4_]; f1 != (DdNode *)0x0; f1 = f1->next) {
      if (f1->ref != 0) {
        f1->index = DVar1;
      }
    }
  }
  f1 = local_c8;
  posn = uVar5;
  while (bVar15 = (byte)iVar7, f1 != (DdNode *)0x0) {
    pDVar10 = f1->next;
    pDVar11 = (((f1->type).kids.T)->type).kids.T;
    (f1->type).kids.T = pDVar11;
    pDVar11->ref = pDVar11->ref + 1;
    pDVar12 = (f1->type).kids.E;
    pDVar12->ref = pDVar12->ref + 1;
    f1->index = DVar4;
    uVar14 = (((uint)(*(long *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 0x20) << 1) |
              (uint)pDVar11 & 1) * 0xc00005 +
             ((uint)(*(long *)(((ulong)pDVar12 & 0xfffffffffffffffe) + 0x20) << 1) |
             (uint)pDVar12 & 1)) * 0x40f1f9 >> (bVar15 & 0x1f);
    f1->next = ppDVar9[(int)uVar14];
    ppDVar9[(int)uVar14] = f1;
    posn = posn + 1;
    f1 = pDVar10;
  }
  f1 = next;
  do {
    bVar16 = (byte)iVar3;
    if (f1 == (DdNode *)0x0) {
      f._4_4_ = 0;
      do {
        if ((int)uVar6 <= (int)f._4_4_) {
          table->subtableZ[x].keys = i;
          table->subtableZ[y].keys = posn;
          table->keysZ = (((i + posn) - uVar2) - uVar5) + table->keysZ;
          table->univ[y] = (DdNode *)(table->univ[x]->type).value;
          return table->keysZ;
        }
        special = (DdNode *)0x0;
        f1 = ppDVar9[(int)f._4_4_];
        while (f1 != (DdNode *)0x0) {
          pDVar10 = f1->next;
          if (f1->ref == 0) {
            pDVar11 = (f1->type).kids.T;
            pDVar11->ref = pDVar11->ref - 1;
            pDVar11 = (f1->type).kids.E;
            pDVar11->ref = pDVar11->ref - 1;
            f1->next = table->nextFree;
            table->nextFree = f1;
            posn = posn + -1;
            if (special == (DdNode *)0x0) {
              ppDVar9[(int)f._4_4_] = pDVar10;
              f1 = pDVar10;
            }
            else {
              special->next = pDVar10;
              f1 = pDVar10;
            }
          }
          else if (f1->index == DVar1) {
            if (special == (DdNode *)0x0) {
              ppDVar9[(int)f._4_4_] = pDVar10;
            }
            else {
              special->next = pDVar10;
            }
            pDVar11 = (f1->type).kids.T;
            pDVar11->ref = pDVar11->ref - 1;
            uVar14 = (((uint)(*(long *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 0x20) << 1) |
                      (uint)pDVar11 & 1) * 0xc00005 +
                     ((uint)(*(long *)(((ulong)empty & 0xfffffffffffffffe) + 0x20) << 1) |
                     (uint)empty & 1)) * 0x40f1f9 >> (bVar15 & 0x1f);
            for (newf0 = ppDVar9[(int)uVar14]; newf0 != (DdNode *)0x0; newf0 = newf0->next) {
              if ((((newf0->type).kids.T == pDVar11) && ((newf0->type).kids.E == empty)) &&
                 (newf0->index == DVar4)) {
                newf0->ref = newf0->ref + 1;
                break;
              }
            }
            if (newf0 == (DdNode *)0x0) {
              newf0 = cuddDynamicAllocNode(table);
              if (newf0 == (DdNode *)0x0) goto LAB_00a4354f;
              newf0->index = DVar4;
              newf0->ref = 1;
              (newf0->type).kids.T = pDVar11;
              (newf0->type).kids.E = empty;
              posn = posn + 1;
              newf0->next = ppDVar9[(int)uVar14];
              ppDVar9[(int)uVar14] = newf0;
              if ((uVar14 == f._4_4_) && (special == (DdNode *)0x0)) {
                special = newf0;
              }
              pDVar11->ref = pDVar11->ref + 1;
              empty->ref = empty->ref + 1;
            }
            (f1->type).kids.T = newf0;
            uVar13 = *(ulong *)((long)&f1->type + 8);
            uVar14 = (((uint)(*(long *)(((ulong)newf0 & 0xfffffffffffffffe) + 0x20) << 1) |
                      (uint)newf0 & 1) * 0xc00005 +
                     ((uint)(*(long *)((uVar13 & 0xfffffffffffffffe) + 0x20) << 1) |
                     (uint)uVar13 & 1)) * 0x40f1f9 >> (bVar16 & 0x1f);
            i = i + 1;
            posn = posn + -1;
            f1->next = ppDVar8[(int)uVar14];
            ppDVar8[(int)uVar14] = f1;
            f1 = pDVar10;
          }
          else {
            special = f1;
            f1 = pDVar10;
          }
        }
        f._4_4_ = f._4_4_ + 1;
      } while( true );
    }
    pDVar10 = f1->next;
    f01 = (f1->type).kids.T;
    if ((f01->index == DVar4) || (f01->index == DVar1)) {
      f10 = (f01->type).kids.T;
      f01 = (f01->type).kids.E;
    }
    else {
      f10 = empty;
    }
    newf1 = (f1->type).kids.E;
    if ((newf1->index == DVar4) || (newf1->index == DVar1)) {
      f00 = (newf1->type).kids.T;
      newf1 = (newf1->type).kids.E;
    }
    else {
      f00 = empty;
    }
    if (f00 == empty) {
      newf0 = f01;
      f01->ref = f01->ref + 1;
    }
    else {
      uVar14 = (((uint)(*(long *)(((ulong)f00 & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f00 & 1) *
                0xc00005 +
               ((uint)(*(long *)(((ulong)f01 & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f01 & 1)) *
               0x40f1f9 >> (bVar15 & 0x1f);
      for (newf0 = ppDVar9[(int)uVar14]; newf0 != (DdNode *)0x0; newf0 = newf0->next) {
        if ((((newf0->type).kids.T == f00) && ((newf0->type).kids.E == f01)) &&
           (newf0->index == DVar4)) {
          newf0->ref = newf0->ref + 1;
          break;
        }
      }
      if (newf0 == (DdNode *)0x0) {
        newf0 = cuddDynamicAllocNode(table);
        if (newf0 == (DdNode *)0x0) {
LAB_00a4354f:
          fprintf((FILE *)table->err,"Error: cuddZddSwapInPlace out of memory\n");
          return 0;
        }
        newf0->index = DVar4;
        newf0->ref = 1;
        (newf0->type).kids.T = f00;
        (newf0->type).kids.E = f01;
        posn = posn + 1;
        newf0->next = ppDVar9[(int)uVar14];
        ppDVar9[(int)uVar14] = newf0;
        f00->ref = f00->ref + 1;
        f01->ref = f01->ref + 1;
      }
    }
    (f1->type).kids.T = newf0;
    if (f10 == empty) {
      g = newf1;
      newf1->ref = newf1->ref + 1;
    }
    else {
      uVar14 = (((uint)(*(long *)(((ulong)f10 & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f10 & 1) *
                0xc00005 +
               ((uint)(*(long *)(((ulong)newf1 & 0xfffffffffffffffe) + 0x20) << 1) | (uint)newf1 & 1
               )) * 0x40f1f9 >> (bVar15 & 0x1f);
      for (g = ppDVar9[(int)uVar14]; g != (DdNode *)0x0; g = g->next) {
        if ((((g->type).kids.T == f10) && ((g->type).kids.E == newf1)) && (g->index == DVar4)) {
          g->ref = g->ref + 1;
          break;
        }
      }
      if (g == (DdNode *)0x0) {
        g = cuddDynamicAllocNode(table);
        if (g == (DdNode *)0x0) goto LAB_00a4354f;
        g->index = DVar4;
        g->ref = 1;
        (g->type).kids.T = f10;
        (g->type).kids.E = newf1;
        posn = posn + 1;
        g->next = ppDVar9[(int)uVar14];
        ppDVar9[(int)uVar14] = g;
        f10->ref = f10->ref + 1;
        newf1->ref = newf1->ref + 1;
      }
    }
    (f1->type).kids.E = g;
    uVar14 = (((uint)(*(long *)(((ulong)newf0 & 0xfffffffffffffffe) + 0x20) << 1) | (uint)newf0 & 1)
              * 0xc00005 +
             ((uint)(*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1) | (uint)g & 1)) *
             0x40f1f9 >> (bVar16 & 0x1f);
    i = i + 1;
    f1->next = ppDVar8[(int)uVar14];
    ppDVar8[(int)uVar14] = f1;
    f1 = pDVar10;
  } while( true );
}

Assistant:

static int
cuddZddLinearInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int         xindex, yindex;
    int         xslots, yslots;
    int         xshift, yshift;
    int         oldxkeys, oldykeys;
    int         newxkeys, newykeys;
    int         i;
    int         posn;
    DdNode      *f, *f1, *f0, *f11, *f10, *f01, *f00;
    DdNode      *newf1, *newf0, *g, *next, *previous;
    DdNode      *special;

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddZddNextHigh(table,x) == y);
    assert(table->subtableZ[x].keys != 0);
    assert(table->subtableZ[y].keys != 0);
    assert(table->subtableZ[x].dead == 0);
    assert(table->subtableZ[y].dead == 0);
#endif

    zddTotalNumberLinearTr++;

    /* Get parameters of x subtable. */
    xindex   = table->invpermZ[x];
    xlist    = table->subtableZ[x].nodelist;
    oldxkeys = table->subtableZ[x].keys;
    xslots   = table->subtableZ[x].slots;
    xshift   = table->subtableZ[x].shift;
    newxkeys = 0;

    /* Get parameters of y subtable. */
    yindex   = table->invpermZ[y];
    ylist    = table->subtableZ[y].nodelist;
    oldykeys = table->subtableZ[y].keys;
    yslots   = table->subtableZ[y].slots;
    yshift   = table->subtableZ[y].shift;
    newykeys = oldykeys;

    /* The nodes in the x layer are put in two chains.  The chain
    ** pointed by g holds the normal nodes. When re-expressed they stay
    ** in the x list. The chain pointed by special holds the elements
    ** that will move to the y list.
    */
    g = special = NULL;
    for (i = 0; i < xslots; i++) {
        f = xlist[i];
        if (f == NULL) continue;
        xlist[i] = NULL;
        while (f != NULL) {
            next = f->next;
            f1 = cuddT(f);
            /* if (f1->index == yindex) */ cuddSatDec(f1->ref);
            f0 = cuddE(f);
            /* if (f0->index == yindex) */ cuddSatDec(f0->ref);
            if ((int) f1->index == yindex && cuddE(f1) == empty &&
                (int) f0->index != yindex) {
                f->next = special;
                special = f;
            } else {
                f->next = g;
                g = f;
            }
            f = next;
        } /* while there are elements in the collision chain */
    } /* for each slot of the x subtable */

    /* Mark y nodes with pointers from above x. We mark them by
    **  changing their index to x.
    */
    for (i = 0; i < yslots; i++) {
        f = ylist[i];
        while (f != NULL) {
            if (f->ref != 0) {
                f->index = xindex;
            }
            f = f->next;
        } /* while there are elements in the collision chain */
    } /* for each slot of the y subtable */

    /* Move special nodes to the y list. */
    f = special;
    while (f != NULL) {
        next = f->next;
        f1 = cuddT(f);
        f11 = cuddT(f1);
        cuddT(f) = f11;
        cuddSatInc(f11->ref);
        f0 = cuddE(f);
        cuddSatInc(f0->ref);
        f->index = yindex;
        /* Insert at the beginning of the list so that it will be
        ** found first if there is a duplicate. The duplicate will
        ** eventually be moved or garbage collected. No node
        ** re-expression will add a pointer to it.
        */
        posn = ddHash(cuddF2L(f11), cuddF2L(f0), yshift);
        f->next = ylist[posn];
        ylist[posn] = f;
        newykeys++;
        f = next;
    }

    /* Take care of the remaining x nodes that must be re-expressed.
    ** They form a linked list pointed by g.
    */
    f = g;
    while (f != NULL) {
#ifdef DD_COUNT
        table->swapSteps++;
#endif
        next = f->next;
        /* Find f1, f0, f11, f10, f01, f00. */
        f1 = cuddT(f);
        if ((int) f1->index == yindex || (int) f1->index == xindex) {
            f11 = cuddT(f1); f10 = cuddE(f1);
        } else {
            f11 = empty; f10 = f1;
        }
        f0 = cuddE(f);
        if ((int) f0->index == yindex || (int) f0->index == xindex) {
            f01 = cuddT(f0); f00 = cuddE(f0);
        } else {
            f01 = empty; f00 = f0;
        }
        /* Create the new T child. */
        if (f01 == empty) {
            newf1 = f10;
            cuddSatInc(newf1->ref);
        } else {
            /* Check ylist for triple (yindex, f01, f10). */
            posn = ddHash(cuddF2L(f01), cuddF2L(f10), yshift);
            /* For each element newf1 in collision list ylist[posn]. */
            newf1 = ylist[posn];
            /* Search the collision chain skipping the marked nodes. */
            while (newf1 != NULL) {
                if (cuddT(newf1) == f01 && cuddE(newf1) == f10 &&
                    (int) newf1->index == yindex) {
                    cuddSatInc(newf1->ref);
                    break; /* match */
                }
                newf1 = newf1->next;
            } /* while newf1 */
            if (newf1 == NULL) {        /* no match */
                newf1 = cuddDynamicAllocNode(table);
                if (newf1 == NULL)
                    goto zddSwapOutOfMem;
                newf1->index = yindex; newf1->ref = 1;
                cuddT(newf1) = f01;
                cuddE(newf1) = f10;
                /* Insert newf1 in the collision list ylist[pos];
                ** increase the ref counts of f01 and f10
                */
                newykeys++;
                newf1->next = ylist[posn];
                ylist[posn] = newf1;
                cuddSatInc(f01->ref);
                cuddSatInc(f10->ref);
            }
        }
        cuddT(f) = newf1;

        /* Do the same for f0. */
        /* Create the new E child. */
        if (f11 == empty) {
            newf0 = f00;
            cuddSatInc(newf0->ref);
        } else {
            /* Check ylist for triple (yindex, f11, f00). */
            posn = ddHash(cuddF2L(f11), cuddF2L(f00), yshift);
            /* For each element newf0 in collision list ylist[posn]. */
            newf0 = ylist[posn];
            while (newf0 != NULL) {
                if (cuddT(newf0) == f11 && cuddE(newf0) == f00 &&
                    (int) newf0->index == yindex) {
                    cuddSatInc(newf0->ref);
                    break; /* match */
                }
                newf0 = newf0->next;
            } /* while newf0 */
            if (newf0 == NULL) {        /* no match */
                newf0 = cuddDynamicAllocNode(table);
                if (newf0 == NULL)
                    goto zddSwapOutOfMem;
                newf0->index = yindex; newf0->ref = 1;
                cuddT(newf0) = f11; cuddE(newf0) = f00;
                /* Insert newf0 in the collision list ylist[posn];
                ** increase the ref counts of f11 and f00.
                */
                newykeys++;
                newf0->next = ylist[posn];
                ylist[posn] = newf0;
                cuddSatInc(f11->ref);
                cuddSatInc(f00->ref);
            }
        }
        cuddE(f) = newf0;

        /* Re-insert the modified f in xlist.
        ** The modified f does not already exists in xlist.
        ** (Because of the uniqueness of the cofactors.)
        */
        posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), xshift);
        newxkeys++;
        f->next = xlist[posn];
        xlist[posn] = f;
        f = next;
    } /* while f != NULL */

    /* GC the y layer and move the marked nodes to the x list. */

    /* For each node f in ylist. */
    for (i = 0; i < yslots; i++) {
        previous = NULL;
        f = ylist[i];
        while (f != NULL) {
            next = f->next;
            if (f->ref == 0) {
                cuddSatDec(cuddT(f)->ref);
                cuddSatDec(cuddE(f)->ref);
                cuddDeallocNode(table, f);
                newykeys--;
                if (previous == NULL)
                    ylist[i] = next;
                else
                    previous->next = next;
            } else if ((int) f->index == xindex) { /* move marked node */
                if (previous == NULL)
                    ylist[i] = next;
                else
                    previous->next = next;
                f1 = cuddT(f);
                cuddSatDec(f1->ref);
                /* Check ylist for triple (yindex, f1, empty). */
                posn = ddHash(cuddF2L(f1), cuddF2L(empty), yshift);
                /* For each element newf1 in collision list ylist[posn]. */
                newf1 = ylist[posn];
                while (newf1 != NULL) {
                    if (cuddT(newf1) == f1 && cuddE(newf1) == empty &&
                        (int) newf1->index == yindex) {
                        cuddSatInc(newf1->ref);
                        break; /* match */
                    }
                    newf1 = newf1->next;
                } /* while newf1 */
                if (newf1 == NULL) {    /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto zddSwapOutOfMem;
                    newf1->index = yindex; newf1->ref = 1;
                    cuddT(newf1) = f1; cuddE(newf1) = empty;
                    /* Insert newf1 in the collision list ylist[posn];
                    ** increase the ref counts of f1 and empty.
                    */
                    newykeys++;
                    newf1->next = ylist[posn];
                    ylist[posn] = newf1;
                    if (posn == i && previous == NULL)
                        previous = newf1;
                    cuddSatInc(f1->ref);
                    cuddSatInc(empty->ref);
                }
                cuddT(f) = newf1;
                f0 = cuddE(f);
                /* Insert f in x list. */
                posn = ddHash(cuddF2L(newf1), cuddF2L(f0), xshift);
                newxkeys++;
                newykeys--;
                f->next = xlist[posn];
                xlist[posn] = f;
            } else {
                previous = f;
            }
            f = next;
        } /* while f */
    } /* for i */

    /* Set the appropriate fields in table. */
    table->subtableZ[x].keys     = newxkeys;
    table->subtableZ[y].keys     = newykeys;

    table->keysZ += newxkeys + newykeys - oldxkeys - oldykeys;

    /* Update univ section; univ[x] remains the same. */
    table->univ[y] = cuddT(table->univ[x]);

#if 0
    (void) fprintf(table->out,"x = %d  y = %d\n", x, y);
    (void) Cudd_DebugCheck(table);
    (void) Cudd_CheckKeys(table);
#endif

    return (table->keysZ);

zddSwapOutOfMem:
    (void) fprintf(table->err, "Error: cuddZddSwapInPlace out of memory\n");

    return (0);

}